

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  Btree *p;
  BtCursor *pBt;
  BtCursor *pBVar1;
  BtCursor *pBVar2;
  int in_EAX;
  int extraout_EAX;
  BtCursor *pBVar3;
  long lVar4;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBt = (BtCursor *)pCur->pBt;
    sqlite3BtreeEnter(p);
    sqlite3BtreeClearCursor(pCur);
    pBVar1 = pCur->pNext;
    pBVar2 = pCur->pPrev;
    pBVar3 = pBVar2;
    if (pBVar2 == (BtCursor *)0x0) {
      pBVar3 = pBt;
    }
    pBVar3->pNext = pBVar1;
    if (pBVar1 != (BtCursor *)0x0) {
      pBVar1->pPrev = pBVar2;
    }
    for (lVar4 = 0; lVar4 <= pCur->iPage; lVar4 = lVar4 + 1) {
      releasePage(pCur->apPage[lVar4]);
    }
    unlockBtreeIfUnused((BtShared *)pBt);
    invalidateOverflowCache(pCur);
    sqlite3BtreeLeave(p);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    int i;
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    sqlite3BtreeClearCursor(pCur);
    if( pCur->pPrev ){
      pCur->pPrev->pNext = pCur->pNext;
    }else{
      pBt->pCursor = pCur->pNext;
    }
    if( pCur->pNext ){
      pCur->pNext->pPrev = pCur->pPrev;
    }
    for(i=0; i<=pCur->iPage; i++){
      releasePage(pCur->apPage[i]);
    }
    unlockBtreeIfUnused(pBt);
    invalidateOverflowCache(pCur);
    /* sqlite3_free(pCur); */
    sqlite3BtreeLeave(pBtree);
  }
  return SQLITE_OK;
}